

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<bool_()>::Action(Action<bool_()> *this,ActionInterface<bool_()> *impl)

{
  ActionAdapter local_28;
  ActionInterface<bool_()> *local_18;
  ActionInterface<bool_()> *impl_local;
  Action<bool_()> *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<bool_()> *)this;
  std::shared_ptr<testing::ActionInterface<bool()>>::
  shared_ptr<testing::ActionInterface<bool()>,void>
            ((shared_ptr<testing::ActionInterface<bool()>> *)&local_28,impl);
  std::function<bool()>::function<testing::Action<bool()>::ActionAdapter,void>
            ((function<bool()> *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}